

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

ostream * spvtools::utils::operator<<(ostream *os,FloatProxy<float> *value)

{
  float fVar1;
  undefined8 uVar2;
  char cVar3;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  local_14;
  
  fVar1 = (float)value->data_;
  cVar3 = '\x02';
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (NAN(fVar1)) {
      cVar3 = '\0';
    }
    else {
      cVar3 = '\x01';
      if (ABS(fVar1) != INFINITY) {
        cVar3 = (1.1754944e-38 <= ABS(fVar1)) + '\x03';
      }
    }
  }
  if ((cVar3 == '\x04') || (cVar3 == '\x02')) {
    uVar2 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 9;
    std::ostream::_M_insert<double>((double)fVar1);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar2;
  }
  else {
    operator<<(os,&local_14);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatProxy<T>& value) {
  auto float_val = value.getAsFloat();
  switch (std::fpclassify(float_val)) {
    case FP_ZERO:
    case FP_NORMAL: {
      auto saved_precision = os.precision();
      os.precision(std::numeric_limits<T>::max_digits10);
      os << float_val;
      os.precision(saved_precision);
    } break;
    default:
      os << HexFloat<FloatProxy<T>>(value);
      break;
  }
  return os;
}